

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_command_line.cpp
# Opt level: O0

void __thiscall
ClCommandLine_DoubleDashStringOptionWithSingleDash_Test::
~ClCommandLine_DoubleDashStringOptionWithSingleDash_Test
          (ClCommandLine_DoubleDashStringOptionWithSingleDash_Test *this)

{
  ClCommandLine_DoubleDashStringOptionWithSingleDash_Test *this_local;
  
  ~ClCommandLine_DoubleDashStringOptionWithSingleDash_Test(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

TEST_F (ClCommandLine, DoubleDashStringOptionWithSingleDash) {
    opt<bool> option ("arg");
    this->add ("progname", "-arg");

    string_stream output;
    string_stream errors;
    bool const res = this->parse_command_line_options (output, errors);
    EXPECT_FALSE (res);
    EXPECT_THAT (errors.str (),
                 testing::HasSubstr (PSTORE_NATIVE_TEXT ("Unknown command line argument")));
    EXPECT_THAT (errors.str (), testing::HasSubstr (PSTORE_NATIVE_TEXT ("'--arg'")));
    EXPECT_EQ (output.str ().length (), 0U);
}